

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

int tcp_listener_get_locaddr(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  socklen_t local_13c;
  undefined1 local_138 [4];
  socklen_t len;
  sockaddr_storage ss;
  nng_sockaddr sa;
  tcp_listener *l;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x130));
  if ((*(byte *)((long)arg + 0x128) & 1) == 0) {
    ss.__ss_align._0_2_ = 0;
  }
  else {
    local_13c = 0x80;
    iVar1 = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0xd8));
    getsockname(iVar1,(sockaddr *)local_138,&local_13c);
    nni_posix_sockaddr2nn((nni_sockaddr *)&ss.__ss_align,local_138,(ulong)local_13c);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
  iVar1 = nni_copyout_sockaddr((nng_sockaddr *)&ss.__ss_align,buf,szp,t);
  return iVar1;
}

Assistant:

static int
tcp_listener_get_locaddr(void *arg, void *buf, size_t *szp, nni_type t)
{
	tcp_listener *l = arg;
	nng_sockaddr  sa;
	nni_mtx_lock(&l->mtx);
	if (l->started) {
		struct sockaddr_storage ss;
		socklen_t               len = sizeof(ss);
		(void) getsockname(
		    nni_posix_pfd_fd(&l->pfd), (void *) &ss, &len);
		(void) nni_posix_sockaddr2nn(&sa, &ss, len);
	} else {
		sa.s_family = NNG_AF_UNSPEC;
	}
	nni_mtx_unlock(&l->mtx);
	return (nni_copyout_sockaddr(&sa, buf, szp, t));
}